

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

void __thiscall crunch::print_stats(crunch *this,convert_stats *stats,bool force_image_stats)

{
  bool bVar1;
  bool grayscale_sampling_00;
  bool local_61;
  char *local_60;
  bool grayscale_sampling;
  bool mip_stats;
  bool image_stats;
  char *pCSVStatsFilename;
  dynamic_string csv_filename;
  bool force_image_stats_local;
  convert_stats *stats_local;
  crunch *this_local;
  
  csv_filename.m_pStr._7_1_ = force_image_stats;
  crnlib::dynamic_string::dynamic_string((dynamic_string *)&pCSVStatsFilename);
  bVar1 = crnlib::command_line_params::get_value_as_string
                    (&this->m_params,"csvfile",0,(dynamic_string *)&pCSVStatsFilename,0);
  if (bVar1) {
    local_60 = crnlib::dynamic_string::get_ptr((dynamic_string *)&pCSVStatsFilename);
  }
  else {
    local_60 = (char *)0x0;
  }
  local_61 = true;
  if ((csv_filename.m_pStr._7_1_ & 1) == 0) {
    bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"imagestats",0,false);
    local_61 = true;
    if (!bVar1) {
      bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"mipstats",0,false);
      local_61 = true;
      if (!bVar1) {
        local_61 = local_60 != (char *)0x0;
      }
    }
  }
  bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"mipstats",0,false);
  grayscale_sampling_00 =
       crnlib::command_line_params::get_value_as_bool(&this->m_params,"grayscalesampling",0,false);
  bVar1 = crnlib::texture_conversion::convert_stats::print
                    (stats,local_61,bVar1,grayscale_sampling_00,local_60);
  if (!bVar1) {
    crnlib::console::warning("Unable to compute/display full output file statistics.");
  }
  crnlib::dynamic_string::~dynamic_string((dynamic_string *)&pCSVStatsFilename);
  return;
}

Assistant:

void print_stats(texture_conversion::convert_stats& stats, bool force_image_stats = false)
    {
        dynamic_string csv_filename;
        const char* pCSVStatsFilename = m_params.get_value_as_string("csvfile", 0, csv_filename) ? csv_filename.get_ptr() : nullptr;

        bool image_stats = force_image_stats || m_params.get_value_as_bool("imagestats") || m_params.get_value_as_bool("mipstats") || (pCSVStatsFilename != nullptr);
        bool mip_stats = m_params.get_value_as_bool("mipstats");
        bool grayscale_sampling = m_params.get_value_as_bool("grayscalesampling");
        if (!stats.print(image_stats, mip_stats, grayscale_sampling, pCSVStatsFilename))
        {
            console::warning("Unable to compute/display full output file statistics.");
        }
    }